

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  reference ppcVar6;
  undefined4 extraout_var;
  cmGeneratorTarget **tgt;
  iterator __end3;
  iterator __begin3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range3;
  undefined1 local_368 [8];
  string message;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  cmGeneratedFileStream fbld;
  undefined1 local_c8 [8];
  string fname;
  undefined1 local_88 [8];
  string name;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  undefined1 local_38 [8];
  string rootBinaryDir;
  cmLocalGenerator *root_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  rootBinaryDir.field_2._8_8_ = root;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  std::__cxx11::string::string((string *)local_38,(string *)psVar5);
  std::__cxx11::string::operator+=((string *)local_38,"/CMakeFiles");
  __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                     (&this->ProjectTargets);
  target = (cmGeneratorTarget *)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                     (&this->ProjectTargets);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                *)&target);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    ppcVar6 = __gnu_cxx::
              __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    name.field_2._8_8_ = *ppcVar6;
    TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)name.field_2._8_8_);
    if (((TVar3 != INTERFACE_LIBRARY) &&
        (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)name.field_2._8_8_),
        TVar3 != MODULE_LIBRARY)) &&
       (TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)name.field_2._8_8_),
       TVar3 != SHARED_LIBRARY)) {
      TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)name.field_2._8_8_);
      if (TVar3 == GLOBAL_TARGET) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)name.field_2._8_8_);
        iVar4 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x18])();
        bVar2 = std::operator!=(psVar5,(char *)CONCAT44(extraout_var,iVar4));
        if (bVar2) goto LAB_003e945a;
      }
      psVar5 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)name.field_2._8_8_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fname.field_2 + 8),psVar5,".tgt");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fname.field_2 + 8),FILE_EXTENSION);
      std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fbld.field_0x240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     "/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fbld.field_0x240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::__cxx11::string::~string((string *)&fbld.field_0x240);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_c8,false,None);
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      WriteFileHeader(this,(ostream *)
                           &build.
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      GhsMultiGpj::WriteGpjTag
                (PROJECT,(ostream *)
                         &build.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               ((long)&message.field_2 + 8);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
                (pvVar1);
      bVar2 = ComputeTargetBuildOrder(this,(cmGeneratorTarget *)name.field_2._8_8_,pvVar1);
      if (bVar2) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)name.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range3,"The inter-target dependency graph for target [",psVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range3,"] had a cycle.\n");
        std::__cxx11::string::~string((string *)&__range3);
        cmSystemTools::Error((string *)local_368);
        std::__cxx11::string::~string((string *)local_368);
      }
      else {
        pvVar1 = (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 ((long)&message.field_2 + 8);
        __end3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(pvVar1);
        tgt = (cmGeneratorTarget **)
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              end(pvVar1);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                           *)&tgt), bVar2) {
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                    ::operator*(&__end3);
          WriteProjectLine(this,(ostream *)
                                &build.
                                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar6,
                           (cmLocalGenerator *)rootBinaryDir.field_2._8_8_,(string *)local_38);
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
          ::operator++(&__end3);
        }
      }
      cmGeneratedFileStream::Close
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
                ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 ((long)&message.field_2 + 8));
      cmGeneratedFileStream::~cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)local_88);
    }
LAB_003e945a:
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();
  rootBinaryDir += "/CMakeFiles";

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = target->GetName() + ".tgt" + FILE_EXTENSION;
    std::string fname = rootBinaryDir + "/" + name;
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (ComputeTargetBuildOrder(target, build)) {
      std::string message = "The inter-target dependency graph for target [" +
        target->GetName() + "] had a cycle.\n";
      cmSystemTools::Error(message);
    } else {
      for (auto& tgt : build) {
        WriteProjectLine(fbld, tgt, root, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}